

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O3

void api_suite::run(void)

{
  undefined4 local_c;
  undefined8 local_8;
  
  test_ctor();
  test_clear();
  local_8 = 4;
  local_c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x3c,"void api_suite::test_capacity()",&local_8,&local_c);
  test_size();
  test_empty();
  test_full();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_clear();
    test_capacity();
    test_size();
    test_empty();
    test_full();
}